

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.h
# Opt level: O2

bool __thiscall spvtools::opt::Edge::operator<(Edge *this,Edge *o)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  
  uVar1 = BasicBlock::id(this->source);
  uVar2 = BasicBlock::id(this->dest);
  uVar3 = BasicBlock::id(o->source);
  uVar4 = BasicBlock::id(o->dest);
  return uVar1 < uVar3 || uVar2 < uVar4 && uVar1 <= uVar3;
}

Assistant:

bool operator<(const Edge& o) const {
    return std::make_pair(source->id(), dest->id()) <
           std::make_pair(o.source->id(), o.dest->id());
  }